

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

pointer __thiscall gmlc::networking::TcpServer::findSocket(TcpServer *this,int connectorID)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  in_RSI;
  element_type *in_RDI;
  pointer pVar2;
  __normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ptr;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  element_type *peVar3;
  __normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  __first;
  __normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  local_30 [6];
  
  peVar3 = in_RDI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffff68);
  __first._M_current =
       (shared_ptr<gmlc::networking::TcpConnection> *)
       &in_RSI._M_current[0xf].
        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::begin((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           *)in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::end((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
         *)in_stack_ffffffffffffff68);
  local_30[0] = std::
                find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>const*,std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>>,gmlc::networking::TcpServer::findSocket(int)const::__0>
                          (__first,in_RSI,
                           (anon_class_4_1_785f0888_for__M_pred)(int)((ulong)peVar3 >> 0x20));
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::end((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
         *)in_stack_ffffffffffffff68);
  bVar1 = __gnu_cxx::
          operator==<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                    ((__normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                      *)in_RDI,
                     (__normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                      *)in_stack_ffffffffffffff68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)in_RDI,in_stack_ffffffffffffff68);
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
    ::operator*(local_30);
    std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)in_RDI,
               (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_ffffffffffffff68);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  pVar2.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar2.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  return (pointer)pVar2.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer TcpServer::findSocket(int connectorID) const
{
    std::unique_lock<std::mutex> lock(accepting);
    auto ptr = std::find_if(
        connections.begin(),
        connections.end(),
        [connectorID](const auto& conn) {
            return (conn->getIdentifier() == connectorID);
        });
    if (ptr != connections.end()) {
        return *ptr;
    }
    return nullptr;
}